

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

DirPathPair * __thiscall
capnp::compiler::CompilerMain::interpretSourceFile
          (DirPathPair *__return_storage_ptr__,CompilerMain *this,StringPtr pathStr)

{
  OutputDirective *pOVar1;
  ProcessContext *pPVar2;
  long lVar3;
  PathPtr prefix_00;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> MVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar7;
  size_t extraout_RDX;
  void *__child_stack;
  undefined1 *puVar8;
  char *__s2;
  char *pcVar9;
  String *pSVar10;
  void *in_R8;
  char *ptrCopy;
  HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory> *this_00;
  long lVar11;
  OutputDirective *pOVar12;
  PathPtr prefix;
  Fault f;
  PathPtr cwd;
  String local_d8;
  Path local_b8;
  String local_98;
  CompilerMain *local_78;
  size_t local_70;
  ArrayPtr<const_char> *local_68;
  PathPtr local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> *local_40;
  long local_38;
  
  iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_60.parts.ptr = (String *)CONCAT44(extraout_var,iVar5);
  local_68 = (ArrayPtr<const_char> *)pathStr.content.ptr;
  local_60.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&local_b8,&local_60,pathStr);
  if ((String *)local_b8.parts.size_ == (String *)0x0) {
    local_98.content.ptr = (char *)0x0;
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_98,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_98);
  }
  puVar8 = (undefined1 *)((long)&(((String *)(local_b8.parts.size_ + -0x18))->content).disposer + 7)
  ;
  local_70 = pathStr.content.size_;
  if (puVar8 == (undefined1 *)0x0) {
    local_d8.content.size_ = (size_t)(String *)0x1;
  }
  else {
    this_00 = &this->sourceDirectories;
    lVar11 = 1 - local_b8.parts.size_;
    lVar3 = local_b8.parts.size_ * 0x18;
    local_78 = this;
    do {
      local_d8.content.ptr = (char *)local_b8.parts.ptr;
      local_98.content.ptr = (char *)((long)&local_b8.parts.ptr[-1].content.ptr + lVar3);
      sVar7 = (long)&((Array<char> *)local_b8.parts.size_)->ptr + lVar11;
      local_d8.content.size_ = (size_t)puVar8;
      local_98.content.size_ = sVar7;
      MVar6 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::
              find<kj::PathPtr&>((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *
                                 )this_00,(PathPtr *)&local_d8);
      if (MVar6.ptr != (SourceDirectory *)0x0) {
        __return_storage_ptr__->dir = ((MVar6.ptr)->dir).ptr;
        kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&local_98,__child_stack,
                           (int)sVar7,in_R8);
        goto LAB_001957a1;
      }
      puVar8 = puVar8 + -1;
      lVar11 = lVar11 + 1;
      local_d8.content.size_ = local_b8.parts.size_;
      this = local_78;
      lVar3 = lVar3 + -0x18;
    } while (lVar11 != 0);
  }
  prefix_00.parts.size_ = local_60.parts.size_;
  prefix_00.parts.ptr = local_60.parts.ptr;
  local_d8.content.ptr = (char *)local_b8.parts.ptr;
  bVar4 = kj::PathPtr::startsWith((PathPtr *)&local_d8,prefix_00);
  if (bVar4) {
    iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
    __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar5);
    local_d8.content.ptr = (char *)(local_b8.parts.ptr + local_60.parts.size_);
    local_d8.content.size_ = local_b8.parts.size_ - local_60.parts.size_;
    kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&local_d8,
                       local_d8.content.ptr,(int)local_d8.content.size_,in_R8);
LAB_001957a1:
    sVar7 = local_b8.parts.size_;
    pSVar10 = local_b8.parts.ptr;
    if (local_b8.parts.ptr != (String *)0x0) {
      local_b8.parts.ptr = (String *)0x0;
      local_b8.parts.size_ = 0;
      (**(local_b8.parts.disposer)->_vptr_ArrayDisposer)
                (local_b8.parts.disposer,pSVar10,0x18,sVar7,sVar7,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
  }
  else {
    pOVar12 = (this->outputs).builder.ptr;
    pOVar1 = (this->outputs).builder.pos;
    local_78 = (CompilerMain *)__return_storage_ptr__;
    if (pOVar12 != pOVar1) {
      do {
        pcVar9 = (pOVar12->name).ptr;
        sVar7 = (pOVar12->name).size_;
        kj::heapString(&local_d8,sVar7);
        if (sVar7 != 0) {
          pSVar10 = (String *)local_d8.content.size_;
          if ((String *)local_d8.content.size_ != (String *)0x0) {
            pSVar10 = (String *)local_d8.content.ptr;
          }
          memcpy(pSVar10,pcVar9,sVar7);
        }
        sVar7 = local_d8.content.size_;
        pcVar9 = local_d8.content.ptr;
        if ((String *)local_d8.content.size_ != (String *)0x6) {
          if ((String *)local_d8.content.size_ == (String *)0x2) {
            __s2 = "-";
            goto LAB_00195742;
          }
LAB_001957da:
          pPVar2 = this->context;
          local_38 = local_70 - 1;
          local_40 = local_68;
          local_50.ptr = 
          ": File is not in the current directory and does not match any prefix defined with --src-prefix. Please pass an appropriate --src-prefix so I can figure out where to write the output for this file."
          ;
          local_50.size_ = 0xc4;
          kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                    (&local_98,(_ *)&local_40,&local_50,local_68);
          pcVar9 = local_98.content.ptr;
          if (local_98.content.size_ == 0) {
            pcVar9 = "";
          }
          (*pPVar2->_vptr_ProcessContext[2])
                    (pPVar2,pcVar9,local_98.content.size_ + (local_98.content.size_ == 0));
          sVar7 = local_98.content.size_;
          pcVar9 = local_98.content.ptr;
          if (local_98.content.ptr != (char *)0x0) {
            local_98.content.ptr = (char *)0x0;
            local_98.content.size_ = 0;
            (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                      (local_98.content.disposer,pcVar9,1,sVar7,sVar7,0);
          }
          sVar7 = local_d8.content.size_;
          pcVar9 = local_d8.content.ptr;
          if ((String *)local_d8.content.ptr != (String *)0x0) {
            local_d8.content.ptr = (char *)0x0;
            local_d8.content.size_ = 0;
            (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
                      (local_d8.content.disposer,pcVar9,1,sVar7,sVar7,0);
          }
          break;
        }
        __s2 = "capnp";
LAB_00195742:
        iVar5 = bcmp(local_d8.content.ptr,__s2,
                     local_d8.content.size_ +
                     ((ulong)((String *)local_d8.content.size_ == (String *)0x0) - 1));
        if (iVar5 != 0) goto LAB_001957da;
        if ((String *)pcVar9 != (String *)0x0) {
          local_d8.content.ptr = (char *)0x0;
          local_d8.content.size_ = 0;
          (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
                    (local_d8.content.disposer,pcVar9,1,sVar7,sVar7);
        }
        pOVar12 = pOVar12 + 1;
      } while (pOVar12 != pOVar1);
    }
    iVar5 = (**((this->disk).ptr)->_vptr_Filesystem)();
    local_78->super_GlobalErrorReporter = (_func_int **)CONCAT44(extraout_var_01,iVar5);
    (((Path *)&local_78->context)->parts).ptr = local_b8.parts.ptr;
    (((Path *)&local_78->context)->parts).size_ = local_b8.parts.size_;
    (((Path *)&local_78->context)->parts).disposer = local_b8.parts.disposer;
    __return_storage_ptr__ = (DirPathPair *)local_78;
  }
  return __return_storage_ptr__;
}

Assistant:

DirPathPair interpretSourceFile(kj::StringPtr pathStr) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    KJ_REQUIRE(path.size() > 0);
    for (size_t i = path.size() - 1; i > 0; i--) {
      auto prefix = path.slice(0, i);
      auto remainder = path.slice(i, path.size());

      KJ_IF_MAYBE(sdir, sourceDirectories.find(prefix)) {
        return { *sdir->dir, remainder.clone() };
      }
    }

    // No source prefix matched. Fall back to heuristic: try stripping the current directory,
    // otherwise don't strip anything.
    if (path.startsWith(cwd)) {
      return { disk->getCurrent(), path.slice(cwd.size(), path.size()).clone() };
    } else {
      // Hmm, no src-prefix matched and the file isn't even in the current directory. This might
      // be OK if we aren't generating any output anyway, but otherwise the results will almost
      // certainly not be what the user wanted. Let's print a warning, unless the output directives
      // are ones which we know do not produce output files. This is a hack.
      for (auto& output: outputs) {
        auto name = kj::str(output.name);
        if (name != "-" && name != "capnp") {
          context.warning(kj::str(pathStr,
              ": File is not in the current directory and does not match any prefix defined with "
              "--src-prefix. Please pass an appropriate --src-prefix so I can figure out where to "
              "write the output for this file."));
          break;
        }
      }

      return { disk->getRoot(), kj::mv(path) };
    }
  }